

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stun_msg.c
# Opt level: O1

int stun_msg_verify(stun_msg_hdr *msg_hdr,size_t msg_size)

{
  ushort uVar1;
  uint uVar2;
  uint32_t uVar3;
  stun_msg_hdr *psVar4;
  stun_msg_hdr *psVar5;
  int iVar6;
  ulong uVar7;
  stun_attr_uint32 *fingerprint;
  
  iVar6 = 0;
  if ((byte)msg_hdr->type < 2) {
    uVar1 = msg_hdr->length;
    uVar7 = (ulong)(ushort)(uVar1 << 8 | uVar1 >> 8);
    iVar6 = 0;
    if ((uVar1 >> 8 & 3) == 0 && uVar7 + 0x14 <= msg_size) {
      if (uVar1 != 0) {
        psVar5 = msg_hdr + 1;
        do {
          psVar4 = psVar5;
          psVar5 = (stun_msg_hdr *)
                   (psVar4->tsx_id +
                   ((ulong)((ushort)(psVar4->length << 8 | psVar4->length >> 8) + 3 & 0xfffffffc) -
                   4));
        } while (psVar5 < (stun_msg_hdr *)(msg_hdr[1].tsx_id + (uVar7 - 8)));
        if (psVar5 != (stun_msg_hdr *)(msg_hdr[1].tsx_id + (uVar7 - 8))) {
          return 0;
        }
        if (psVar4->type == 0x2880) {
          uVar3 = crc32(0,msg_hdr,(long)psVar4 - (long)msg_hdr);
          uVar2 = psVar4->magic;
          if (((uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18) ^
              uVar3) != 0x5354554e) {
            return 0;
          }
        }
      }
      iVar6 = 1;
    }
  }
  return iVar6;
}

Assistant:

int stun_msg_verify(const stun_msg_hdr *msg_hdr, size_t msg_size) {
  size_t msg_len;
  const uint8_t *p = (const uint8_t*)msg_hdr;
  const uint8_t *p_end;
  const stun_attr_hdr *attr_hdr;

  /* First byte of STUN message is always 0x00 or 0x01. */
  if (*p != 0x00 && *p != 0x01)
    return 0;

  /* Check the length, it cannot exceed the message size. */
  msg_len = stun_msg_len(msg_hdr);
  if (msg_len > msg_size)
    return 0;

  /* STUN message is always padded to the nearest 4 bytes, thus
   * the last two bits of the length field are always zero.
   */
  if ((msg_len & 0x03) != 0)
    return 0;

  /* Check if the attribute lengths don't exceed the message length. */
  p_end = p + msg_len;
  p += sizeof(stun_msg_hdr);
  if (p == p_end)
    return 1; /* It's an empty message, nothing else to check */
  do {
    attr_hdr = (const stun_attr_hdr *)p;
    p += stun_attr_block_len(attr_hdr);
  } while (p < p_end);
  if (p != p_end)
    return 0;

  /* If FINGERPRINT is the last attribute, check if is valid */
  if (ntohs(attr_hdr->type) == STUN_ATTR_FINGERPRINT) {
    const stun_attr_uint32 *fingerprint =
        (const stun_attr_uint32 *)attr_hdr;
    if (!stun_attr_fingerprint_check(fingerprint, msg_hdr))
      return 0;
  }

  return 1; /* all is well */
}